

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniscript_tests.cpp
# Opt level: O1

optional<CPubKey> * __thiscall
(anonymous_namespace)::KeyConverter::
FromPKBytes<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
          (optional<CPubKey> *__return_storage_ptr__,void *this,
          __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          first,__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                last)

{
  bool bVar1;
  ptrdiff_t _Num;
  long in_FS_OFFSET;
  XOnlyPubKey xonly_pubkey;
  CPubKey local_68;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (*this == 0) {
    CPubKey::
    Set<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (&local_68,first,last);
    if (((local_68.vch[0] & 0xfe) == 2) ||
       ((bVar1 = false, local_68.vch[0] < 8 && ((0xd0U >> (local_68.vch[0] & 0x1f) & 1) != 0)))) {
      memcpy(__return_storage_ptr__,&local_68,0x41);
      bVar1 = true;
    }
    (__return_storage_ptr__->super__Optional_base<CPubKey,_true,_true>)._M_payload.
    super__Optional_payload_base<CPubKey>._M_engaged = bVar1;
  }
  else {
    if (*this != 1) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/script/miniscript.h"
                    ,0xf6,"bool miniscript::IsTapscript(MiniscriptContext)");
    }
    if ((long)last._M_current - (long)first._M_current == 0x20) {
      local_68.vch[0x10] = '\0';
      local_68.vch[0x11] = '\0';
      local_68.vch[0x12] = '\0';
      local_68.vch[0x13] = '\0';
      local_68.vch[0x14] = '\0';
      local_68.vch[0x15] = '\0';
      local_68.vch[0x16] = '\0';
      local_68.vch[0x17] = '\0';
      local_68.vch[0x18] = '\0';
      local_68.vch[0x19] = '\0';
      local_68.vch[0x1a] = '\0';
      local_68.vch[0x1b] = '\0';
      local_68.vch[0x1c] = '\0';
      local_68.vch[0x1d] = '\0';
      local_68.vch[0x1e] = '\0';
      local_68.vch[0x1f] = '\0';
      local_68.vch[0] = '\0';
      local_68.vch[1] = '\0';
      local_68.vch[2] = '\0';
      local_68.vch[3] = '\0';
      local_68.vch[4] = '\0';
      local_68.vch[5] = '\0';
      local_68.vch[6] = '\0';
      local_68.vch[7] = '\0';
      local_68.vch[8] = '\0';
      local_68.vch[9] = '\0';
      local_68.vch[10] = '\0';
      local_68.vch[0xb] = '\0';
      local_68.vch[0xc] = '\0';
      local_68.vch[0xd] = '\0';
      local_68.vch[0xe] = '\0';
      local_68.vch[0xf] = '\0';
      if (last._M_current != first._M_current) {
        memcpy(&local_68,first._M_current,0x20);
      }
      XOnlyPubKey::GetEvenCorrespondingCPubKey
                ((CPubKey *)__return_storage_ptr__,(XOnlyPubKey *)&local_68);
      (__return_storage_ptr__->super__Optional_base<CPubKey,_true,_true>)._M_payload.
      super__Optional_payload_base<CPubKey>._M_engaged = true;
    }
    else {
      (__return_storage_ptr__->super__Optional_base<CPubKey,_true,_true>)._M_payload.
      super__Optional_payload_base<CPubKey>._M_engaged = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<Key> FromPKBytes(I first, I last) const {
        if (!miniscript::IsTapscript(m_script_ctx)) {
            Key key{first, last};
            if (key.IsValid()) return key;
            return {};
        }
        if (last - first != 32) return {};
        XOnlyPubKey xonly_pubkey;
        std::copy(first, last, xonly_pubkey.begin());
        return xonly_pubkey.GetEvenCorrespondingCPubKey();
    }